

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<float,_float>_>,_0,_0>
     ::run(restricted_packet_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>_>
           *kernel)

{
  DstXprType *pDVar1;
  Index col;
  long col_00;
  Index inner;
  long row;
  
  pDVar1 = (kernel->
           super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
           ).m_dstExpr;
  for (col_00 = 0;
      col_00 < (pDVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols; col_00 = col_00 + 1) {
    for (row = 0; row < (pDVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows; row = row + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
      ::assignCoeff(&kernel->
                     super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
                    ,row,col_00);
      pDVar1 = (kernel->
               super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_1>
               ).m_dstExpr;
    }
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE run(Kernel &kernel)
  {
    for(Index outer = 0; outer < kernel.outerSize(); ++outer) {
      for(Index inner = 0; inner < kernel.innerSize(); ++inner) {
        kernel.assignCoeffByOuterInner(outer, inner);
      }
    }
  }